

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char * test_and_fetch(char *fn)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  FILE *pFVar4;
  hFILE *fp_00;
  void *buffer;
  ssize_t sVar5;
  char *local_48;
  char *p;
  int l;
  uint8_t *buf;
  hFILE *fp_remote;
  int buf_size;
  FILE *fp;
  char *fn_local;
  
  iVar2 = hisremote(fn);
  if (iVar2 == 0) {
    pFVar4 = fopen(fn,"rb");
    if (pFVar4 == (FILE *)0x0) {
      fn_local = (char *)0x0;
    }
    else {
      fclose(pFVar4);
      fn_local = fn;
    }
  }
  else {
    sVar3 = strlen(fn);
    pcVar1 = fn + sVar3;
    do {
      fn_local = pcVar1;
      local_48 = fn_local + -1;
      if (local_48 < fn) break;
      pcVar1 = local_48;
    } while (*local_48 != '/');
    pFVar4 = fopen(fn_local,"rb");
    if (pFVar4 == (FILE *)0x0) {
      fp_00 = hopen(fn,"r");
      if (fp_00 == (hFILE *)0x0) {
        fn_local = (char *)0x0;
      }
      else {
        pFVar4 = fopen(fn_local,"w");
        if (pFVar4 == (FILE *)0x0) {
          if (0 < hts_verbose) {
            fprintf(_stderr,"[E::%s] fail to create file \'%s\' in the working directory\n",
                    "test_and_fetch",fn_local);
          }
          hclose_abruptly(fp_00);
          fn_local = (char *)0x0;
        }
        else {
          if (2 < hts_verbose) {
            fprintf(_stderr,"[M::%s] downloading file \'%s\' to local directory\n","test_and_fetch",
                    fn);
          }
          buffer = calloc(0x100000,1);
          while( true ) {
            sVar5 = hread(fp_00,buffer,0x100000);
            if ((int)sVar5 < 1) break;
            fwrite(buffer,1,(long)(int)sVar5,pFVar4);
          }
          free(buffer);
          fclose(pFVar4);
          iVar2 = hclose(fp_00);
          if (iVar2 != 0) {
            fprintf(_stderr,"[E::%s] fail to close remote file \'%s\'\n","test_and_fetch",fn);
          }
        }
      }
    }
    else {
      fclose(pFVar4);
    }
  }
  return fn_local;
}

Assistant:

static char *test_and_fetch(const char *fn)
{
    FILE *fp;
    if (hisremote(fn)) {
        const int buf_size = 1 * 1024 * 1024;
        hFILE *fp_remote;
        uint8_t *buf;
        int l;
        const char *p;
        for (p = fn + strlen(fn) - 1; p >= fn; --p)
            if (*p == '/') break;
        ++p; // p now points to the local file name
        // Attempt to open local file first
        if ((fp = fopen((char*)p, "rb")) != 0)
        {
            fclose(fp);
            return (char*)p;
        }
        // Attempt to open remote file. Stay quiet on failure, it is OK to fail when trying first .csi then .tbi index.
        if ((fp_remote = hopen(fn, "r")) == 0) return 0;
        if ((fp = fopen(p, "w")) == 0) {
            if (hts_verbose >= 1) fprintf(stderr, "[E::%s] fail to create file '%s' in the working directory\n", __func__, p);
            hclose_abruptly(fp_remote);
            return 0;
        }
        if (hts_verbose >= 3) fprintf(stderr, "[M::%s] downloading file '%s' to local directory\n", __func__, fn);
        buf = (uint8_t*)calloc(buf_size, 1);
        while ((l = hread(fp_remote, buf, buf_size)) > 0) fwrite(buf, 1, l, fp);
        free(buf);
        fclose(fp);
        if (hclose(fp_remote) != 0) fprintf(stderr, "[E::%s] fail to close remote file '%s'\n", __func__, fn);
        return (char*)p;
    } else {
        if ((fp = fopen(fn, "rb")) == 0) return 0;
        fclose(fp);
        return (char*)fn;
    }
}